

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

void __thiscall xemmai::t_lexer::t_error::t_error(t_error *this,t_lexer *a_lexer)

{
  size_t sVar1;
  wstring_view a_message;
  
  a_message._M_str = L"lexical error.";
  a_message._M_len = 0xe;
  t_throwable::t_throwable(&this->super_t_throwable,a_message);
  (this->super_t_throwable)._vptr_t_throwable = (_func_int **)&PTR__t_error_001ad9a0;
  std::__cxx11::wstring::wstring((wstring *)&this->v_path,&a_lexer->v_path);
  (this->v_at).v_column = (a_lexer->v_at).v_column;
  sVar1 = (a_lexer->v_at).v_line;
  (this->v_at).v_position = (a_lexer->v_at).v_position;
  (this->v_at).v_line = sVar1;
  return;
}

Assistant:

t_error(t_lexer& a_lexer) : t_throwable(L"lexical error."sv), v_path(a_lexer.f_path()), v_at(a_lexer.f_at())
		{
		}